

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimpledrag.cpp
# Opt level: O2

void __thiscall QBasicDrag::cancel(QBasicDrag *this)

{
  disableEventFilter(this);
  restoreCursor(this);
  QWindow::setVisible((QWindow *)this->m_drag_icon_window,false);
  return;
}

Assistant:

void QBasicDrag::cancel()
{
    disableEventFilter();
    restoreCursor();
    m_drag_icon_window->setVisible(false);
}